

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDAGetNumResEvalsSens(void *ida_mem,long *nrevalsS)

{
  long *in_RSI;
  IDAMem in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x7bd,"IDAGetNumResEvalsSens",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_sensi == 0) {
    IDAProcessError(in_RDI,-0x28,0x7c5,"IDAGetNumResEvalsSens",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"Illegal attempt to call before calling IDASensInit.");
    local_4 = -0x28;
  }
  else {
    *in_RSI = in_RDI->ida_nreS;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetNumResEvalsSens(void* ida_mem, long int* nrevalsS)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  *nrevalsS = IDA_mem->ida_nreS;

  return (IDA_SUCCESS);
}